

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeasurementFactory.cpp
# Opt level: O2

Measurement * __thiscall
MeasurementFactory::CreateMeasurement
          (MeasurementFactory *this,istringstream *iss,SensorContainer *sensors)

{
  Sensor *sensor;
  double *__ptr;
  double *__tmp;
  mapped_type *ppSVar1;
  long lVar2;
  Measurement *pMVar3;
  double *pdVar4;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar5;
  istringstream *this_00;
  float rho_dot;
  float theta;
  float py;
  float px;
  float vy_gt;
  float vx_gt;
  double local_80;
  VectorXd measurements;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_68;
  long timestamp;
  string sensor_type;
  
  sensor_type._M_dataplus._M_p = (pointer)&sensor_type.field_2;
  sensor_type._M_string_length = 0;
  sensor_type.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)iss,(string *)&sensor_type);
  ppSVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
            ::at(sensors,&sensor_type);
  sensor = *ppSVar1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&measurements,(long)sensor->df_);
  lVar2 = __dynamic_cast(sensor,&Sensor::typeinfo,&LidarSensor::typeinfo,0);
  if (lVar2 == 0) {
    lVar2 = __dynamic_cast(sensor,&Sensor::typeinfo,&RadarSensor::typeinfo,0);
    if (lVar2 == 0) goto LAB_00134838;
    std::istream::_M_extract<float>((float *)iss);
    std::istream::_M_extract<float>((float *)iss);
    std::istream::_M_extract<float>((float *)iss);
    local_68.m_row = 0;
    local_68.m_col = 1;
    local_68.m_currentBlockRows = 1;
    *measurements.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double)py;
    local_80 = (double)theta;
    local_68.m_xpr = &measurements;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (&local_68,&local_80);
    _px = (double)rho_dot;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              (pCVar5,(Scalar *)&px);
  }
  else {
    std::istream::_M_extract<float>((float *)iss);
    std::istream::_M_extract<float>((float *)iss);
    local_68.m_row = 0;
    local_68.m_col = 1;
    local_68.m_currentBlockRows = 1;
    *measurements.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double)px;
    local_80 = (double)py;
    local_68.m_xpr = &measurements;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(&local_68,&local_80)
    ;
  }
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_68);
LAB_00134838:
  this_00 = iss;
  std::istream::_M_extract<long>((long *)iss);
  pMVar3 = CreateMeasurement((MeasurementFactory *)this_00,sensor,timestamp,&measurements);
  if (pMVar3 != (Measurement *)0x0) {
    std::istream::_M_extract<float>((float *)iss);
    std::istream::_M_extract<float>((float *)iss);
    std::istream::_M_extract<float>((float *)iss);
    std::istream::_M_extract<float>((float *)iss);
    pdVar4 = (double *)Eigen::internal::aligned_malloc(0x20);
    __ptr = (pMVar3->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data;
    (pMVar3->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
    .m_data = pdVar4;
    (pMVar3->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
    .m_rows = 4;
    free(__ptr);
    local_68.m_row = 0;
    local_68.m_col = 1;
    local_68.m_currentBlockRows = 1;
    *(pMVar3->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
     m_storage.m_data = (double)theta;
    local_80 = (double)rho_dot;
    local_68.m_xpr = &pMVar3->ground_truth_;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (&local_68,&local_80);
    _px = (double)vx_gt;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar5,(Scalar *)&px);
    _py = (double)vy_gt;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              (pCVar5,(Scalar *)&py);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_68);
  }
  free(measurements.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
  ;
  std::__cxx11::string::~string((string *)&sensor_type);
  return pMVar3;
}

Assistant:

Measurement *MeasurementFactory::CreateMeasurement(std::istringstream &iss, const SensorContainer &sensors) {

    string sensor_type;
    const Sensor *sensor = 0;
    SensorContainer::iterator si;
    long timestamp;

    iss >> sensor_type;

    try {
        sensor = sensors.at(sensor_type);
    } catch (const std::out_of_range &e) {
        // discard measurement because sensor not valid
   	//std::cout << "Invalid sensor type" << std::endl;
        return 0;
    }

    VectorXd measurements(sensor->df_);

    if (dynamic_cast<const LidarSensor*>(sensor) != 0) {
      float px;
      float py;
      
      iss >> px;
      iss >> py;

      measurements << px, py;

    } else if (dynamic_cast<const RadarSensor*>(sensor) != 0) {
      float rho;
      float theta;
      float rho_dot;

      iss >> rho;
      iss >> theta;
      iss >> rho_dot;

      measurements << rho, theta, rho_dot;
    }   

    iss >> timestamp;

    Measurement *m = CreateMeasurement(sensor, timestamp, measurements);

    // read ground truth data and store it with the measurement
    if (m) {

        float x_gt;
        float y_gt;
        float vx_gt;
        float vy_gt;
        iss >> x_gt;
        iss >> y_gt;
        iss >> vx_gt;
        iss >> vy_gt;
	m->ground_truth_ = VectorXd(4);
        m->ground_truth_  << x_gt, y_gt, vx_gt, vy_gt;
    }

    return m;
}